

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O1

sockaddr * net_uv::net_getsocketAddr_no(char *ip,uint32_t port,bool isIPV6,uint32_t *outAddrLen)

{
  int iVar1;
  sockaddr_in6 *addr;
  
  if (outAddrLen != (uint32_t *)0x0) {
    *outAddrLen = 0;
  }
  if (isIPV6) {
    addr = (sockaddr_in6 *)malloc(0x1c);
    iVar1 = uv_ip6_addr(ip,port,addr);
  }
  else {
    addr = (sockaddr_in6 *)malloc(0x10);
    iVar1 = uv_ip4_addr(ip,port,(sockaddr_in *)addr);
  }
  if (iVar1 == 0) {
    if (outAddrLen != (uint32_t *)0x0) {
      *outAddrLen = 0x1c;
    }
  }
  else {
    free(addr);
    addr = (sockaddr_in6 *)0x0;
  }
  return (sockaddr *)addr;
}

Assistant:

struct sockaddr* net_getsocketAddr_no(const char* ip, uint32_t port, bool isIPV6, uint32_t* outAddrLen)
{
	if (outAddrLen)
	{
		*outAddrLen = 0;
	}

	if (isIPV6)
	{
		struct sockaddr_in6* send_addr = (struct sockaddr_in6*)fc_malloc(sizeof(struct sockaddr_in6));
		int32_t r = uv_ip6_addr(ip, port, send_addr);

		if (r != 0)
		{
			fc_free(send_addr);
			return NULL;
		}

		if (outAddrLen)
		{
			*outAddrLen = sizeof(struct sockaddr_in6);
		}

		return (struct sockaddr*)send_addr;
	}
	struct sockaddr_in* send_addr = (struct sockaddr_in*)fc_malloc(sizeof(struct sockaddr_in));
	int32_t r = uv_ip4_addr(ip, port, send_addr);

	if (r != 0)
	{
		fc_free(send_addr);
		return NULL;
	}

	if (outAddrLen)
	{
		*outAddrLen = sizeof(struct sockaddr_in6);
	}

	return (struct sockaddr*)send_addr;
}